

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O3

void __thiscall Blip_Buffer::Blip_Buffer(Blip_Buffer *this)

{
  this->samples_per_sec = 0xac44;
  this->clocks_per_sec = 0;
  this->factor_ = 0xffffffffffffffff;
  this->offset_ = 0;
  this->buffer_ = (buf_t_ *)0x0;
  this->buffer_size_ = 0;
  this->bass_freq_ = 0x10;
  this->length_ = 0;
  return;
}

Assistant:

Blip_Buffer::Blip_Buffer()
{
	samples_per_sec = 44100;
	buffer_ = NULL;
	
	// try to cause assertion failure if buffer is used before these are set
	clocks_per_sec = 0;
	factor_ = ~0ul;
	offset_ = 0;
	buffer_size_ = 0;
	length_ = 0;
	
	bass_freq_ = 16;
}